

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::no_thousands_sep>
                    (undefined8 param_1,undefined8 param_2,undefined4 param_3)

{
  char *begin;
  type pwVar1;
  char *end;
  char_type buffer [26];
  char *in_stack_ffffffffffffffb8;
  undefined1 local_38 [28];
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = param_3;
  local_18 = param_2;
  local_10 = param_1;
  begin = format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>
                    (local_38,param_2,param_3);
  pwVar1 = copy_str<wchar_t,char*,wchar_t*>(begin,in_stack_ffffffffffffffb8,(wchar_t *)0x13faae);
  return pwVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}